

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  int iVar1;
  Parser *pPVar2;
  string *psVar3;
  undefined8 uVar4;
  pointer pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined2 uStack_18;
  undefined2 uStack_16;
  undefined4 uStack_14;
  undefined2 uStack_10;
  undefined6 uStack_e;
  
  iVar1 = *(int *)&(this->super_BaseGenerator)._vptr_BaseGenerator;
  switch(iVar1) {
  case 1:
    psVar3 = (this->super_BaseGenerator).path_;
    if ((psVar3 == (string *)0x0) || (*(int *)&psVar3[6].field_2 == iVar1)) {
      local_28 = 4;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      uStack_18 = 0;
      uStack_16 = 0;
      uStack_14 = 0;
      uStack_10 = 0;
    }
    else {
      uVar4 = *(undefined8 *)((long)&psVar3[6].field_2 + 8);
      pcVar5 = psVar3[7]._M_dataplus._M_p;
      uStack_18 = SUB82(pcVar5,0);
      uStack_16 = (undefined2)((ulong)pcVar5 >> 0x10);
      uStack_14 = (undefined4)((ulong)pcVar5 >> 0x20);
      uStack_10 = (undefined2)psVar3[7]._M_string_length;
      uStack_e = (undefined6)(psVar3[7]._M_string_length >> 0x10);
      local_28 = (undefined4)psVar3[6].field_2._M_allocated_capacity;
      uStack_24 = (undefined4)(psVar3[6].field_2._M_allocated_capacity >> 0x20);
      uStack_20 = (undefined4)uVar4;
      uStack_1c = (undefined4)((ulong)uVar4 >> 0x20);
    }
    goto LAB_00263abe;
  case 2:
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Int8";
    pcVar6 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Uint8";
    pcVar6 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Int16";
    pcVar6 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Uint16";
    pcVar6 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Int32";
    pcVar6 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Uint32";
    pcVar6 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Int64";
    pcVar6 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Uint64";
    pcVar6 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Float32";
    pcVar6 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "Float64";
    pcVar6 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "String";
    pcVar6 = "";
    break;
  case 0xe:
    local_28 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    pPVar2 = (this->super_BaseGenerator).parser_;
    psVar3 = (this->super_BaseGenerator).path_;
    uStack_10 = *(undefined2 *)&(this->super_BaseGenerator).file_name_;
    uStack_24 = 0;
    uStack_20 = SUB84(pPVar2,0);
    uStack_1c = (undefined4)((ulong)pPVar2 >> 0x20);
    uStack_18 = SUB82(psVar3,0);
    uStack_16 = (undefined2)((ulong)psVar3 >> 0x10);
    uStack_14 = (undefined4)((ulong)psVar3 >> 0x20);
LAB_00263abe:
    GenType_abi_cxx11_(__return_storage_ptr__,(TsGenerator *)&stack0xffffffffffffffd8,
                       (Type *)&switchD_002638f2::switchdataD_00377390);
    return __return_storage_ptr__;
  case 0xf:
    pPVar2 = (this->super_BaseGenerator).parser_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (pPVar2->super_ParserState).prev_cursor_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar6,
               (pPVar2->super_ParserState).cursor_ + (long)pcVar6);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "flatbuffers.Table";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE: return GenType(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      default: return "flatbuffers.Table";
    }
  }